

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing_10.1.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  X *item;
  pointer this;
  allocator_type local_39;
  vector<X,_std::allocator<X>_> list;
  
  std::vector<X,_std::allocator<X>_>::vector(&list,5,&local_39);
  increment_all(&list);
  for (this = list.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data.
              _M_start;
      this != list.super__Vector_base<X,_std::allocator<X>_>._M_impl.super__Vector_impl_data.
              _M_finish; this = this + 1) {
    iVar1 = X::get_value(this);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::operator<<(poVar2,", ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<X,_std::allocator<X>_>::~_Vector_base
            (&list.super__Vector_base<X,_std::allocator<X>_>);
  return 0;
}

Assistant:

int main() {
  std::vector<X> list(5);
  increment_all(list);
  for (auto const &item : list)
    std::cout << item.get_value() << ", ";
  std::cout << std::endl;
  return 0;
}